

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O0

void __thiscall CLayerTiles::ExtractTiles(CLayerTiles *this,CTile *pSavedTiles)

{
  bool bVar1;
  uint Counter;
  int i;
  CTile *pSavedTiles_local;
  CLayerTiles *this_local;
  
  i = 0;
  pSavedTiles_local = pSavedTiles;
  while (i < this->m_Width * this->m_Height) {
    Counter = 0;
    while( true ) {
      bVar1 = false;
      if (Counter <= pSavedTiles_local->m_Skip) {
        bVar1 = i < this->m_Width * this->m_Height;
      }
      if (!bVar1) break;
      this->m_pTiles[i] = *pSavedTiles_local;
      this->m_pTiles[i].m_Skip = '\0';
      Counter = Counter + 1;
      i = i + 1;
    }
    pSavedTiles_local = pSavedTiles_local + 1;
  }
  return;
}

Assistant:

void CLayerTiles::ExtractTiles(CTile *pSavedTiles)
{
	int i = 0;
	while(i < m_Width * m_Height)
	{
		for(unsigned Counter = 0; Counter <= pSavedTiles->m_Skip && i < m_Width * m_Height; Counter++)
		{
			m_pTiles[i] = *pSavedTiles;
			m_pTiles[i++].m_Skip = 0;
		}

		pSavedTiles++;
	}
}